

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.h
# Opt level: O2

void __thiscall cnn::Trainer::status(Trainer *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[epoch=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->epoch);
  poVar1 = std::operator<<(poVar1," eta=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->eta);
  poVar1 = std::operator<<(poVar1," clips=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->clips);
  poVar1 = std::operator<<(poVar1," updates=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->updates);
  std::operator<<(poVar1,"] ");
  this->clips = 0.0;
  this->updates = 0.0;
  return;
}

Assistant:

void status() {
    std::cerr << "[epoch=" << epoch << " eta=" << eta << " clips=" << clips << " updates=" << updates << "] ";
    updates = clips = 0;
  }